

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int lj_cf_string_rep(lua_State *L)

{
  int32_t iVar1;
  lua_State *sb_00;
  GCstr *pGVar2;
  ulong uVar3;
  lua_State *L_00;
  undefined4 *puVar4;
  long in_RDI;
  GCstr *s2;
  SBuf *sb;
  GCstr *sep;
  int32_t rep;
  GCstr *s;
  SBuf *sb_1;
  GCstr *in_stack_ffffffffffffff30;
  lua_State *in_stack_ffffffffffffff38;
  lua_State *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  sb_00 = (lua_State *)
          lj_lib_checkstr(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20))
  ;
  iVar1 = lj_lib_checkint(in_stack_ffffffffffffff38,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20))
  ;
  pGVar2 = lj_lib_optstr(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  uVar3 = (ulong)*(uint *)(in_RDI + 8);
  L_00 = (lua_State *)(uVar3 + 0xe8);
  *(int *)(uVar3 + 0xf4) = (int)in_RDI;
  (L_00->nextgc).gcptr32 = *(uint32_t *)(uVar3 + 0xf0);
  if ((pGVar2 != (GCstr *)0x0) && (1 < iVar1)) {
    in_stack_ffffffffffffff38 =
         (lua_State *)
         lj_buf_cat2str(L_00,(GCstr *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    (L_00->nextgc).gcptr32 = (L_00->glref).ptr32;
    lj_buf_putstr((SBuf *)L_00,(GCstr *)in_stack_ffffffffffffff38);
    iVar1 = iVar1 + -1;
    sb_00 = in_stack_ffffffffffffff38;
  }
  lj_buf_putstr_rep((SBuf *)sb_00,(GCstr *)CONCAT44(iVar1,in_stack_ffffffffffffff50),
                    (int32_t)((ulong)pGVar2 >> 0x20));
  puVar4 = (undefined4 *)(*(long *)(in_RDI + 0x18) + -8);
  pGVar2 = lj_str_new((lua_State *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  *puVar4 = (int)pGVar2;
  puVar4[1] = 0xfffffffb;
  if (*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x54) <=
      *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x50)) {
    lj_gc_step(in_stack_ffffffffffffff38);
  }
  return 1;
}

Assistant:

LJLIB_CF(string_rep)		LJLIB_REC(.)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  int32_t rep = lj_lib_checkint(L, 2);
  GCstr *sep = lj_lib_optstr(L, 3);
  SBuf *sb = lj_buf_tmp_(L);
  if (sep && rep > 1) {
    GCstr *s2 = lj_buf_cat2str(L, sep, s);
    lj_buf_reset(sb);
    lj_buf_putstr(sb, s);
    s = s2;
    rep--;
  }
  sb = lj_buf_putstr_rep(sb, s, rep);
  setstrV(L, L->top-1, lj_buf_str(L, sb));
  lj_gc_check(L);
  return 1;
}